

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O0

void fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul
               (uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  ulong uVar77;
  ulong uVar78;
  uint64_t x41;
  uint64_t x40;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x39;
  uint64_t x38;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x37;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x36;
  uint64_t x35;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x34;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x33;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x32;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x31;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x30;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x29;
  uint64_t x28;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x27;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x26;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x25;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x24;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x23;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x22;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x21;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x20;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x19;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x18;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x17;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x16;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x15;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x14;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x13;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x12;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x11;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x10;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x9;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x8;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x7;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x6;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x5;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x4;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x3;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x2;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x1;
  uint64_t x52;
  uint64_t x51;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x50;
  uint64_t x49;
  uint64_t x48;
  uint64_t x47;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x46;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x45;
  uint64_t x44;
  uint64_t x43;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x42;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI[4];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = in_RDX[4];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = SUB168(auVar1 * auVar37,0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_RSI[4];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = in_RDX[3];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SUB168(auVar3 * auVar38,0);
  uVar68 = SUB168(auVar4 * ZEXT816(0x269),0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = in_RSI[4];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = in_RDX[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SUB168(auVar5 * auVar39,0);
  uVar69 = SUB168(auVar6 * ZEXT816(0x269),0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = in_RSI[4];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = in_RDX[1];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SUB168(auVar7 * auVar40,0);
  uVar70 = SUB168(auVar8 * ZEXT816(0x4d2),0);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = in_RSI[3];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = in_RDX[4];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SUB168(auVar9 * auVar41,0);
  uVar71 = SUB168(auVar10 * ZEXT816(0x269),0);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = in_RSI[3];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = in_RDX[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SUB168(auVar11 * auVar42,0);
  uVar72 = SUB168(auVar12 * ZEXT816(0x269),0);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = in_RSI[3];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = in_RDX[2];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = SUB168(auVar13 * auVar43,0);
  uVar73 = SUB168(auVar14 * ZEXT816(0x4d2),0);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = in_RSI[2];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = in_RDX[4];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = SUB168(auVar15 * auVar44,0);
  uVar74 = SUB168(auVar16 * ZEXT816(0x269),0);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = in_RSI[2];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = in_RDX[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = SUB168(auVar17 * auVar45,0);
  uVar75 = SUB168(auVar18 * ZEXT816(0x4d2),0);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = in_RSI[1];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = in_RDX[4];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = SUB168(auVar19 * auVar46,0);
  uVar76 = SUB168(auVar20 * ZEXT816(0x4d2),0);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = in_RSI[4];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *in_RDX;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = in_RSI[3];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = in_RDX[1] * 2;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = in_RSI[3];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *in_RDX;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = in_RSI[2];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = in_RDX[2] * 2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = in_RSI[2];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = in_RDX[1] * 2;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = in_RSI[2];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *in_RDX;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = in_RSI[1];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = in_RDX[3] * 2;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = in_RSI[1];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = in_RDX[2] * 2;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = in_RSI[1];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = in_RDX[1] * 2;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = in_RSI[1];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *in_RDX;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *in_RSI;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = in_RDX[4];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *in_RSI;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = in_RDX[3];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *in_RSI;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = in_RDX[2];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *in_RSI;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = in_RDX[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *in_RSI;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *in_RDX;
  uVar78 = uVar73 + uVar70;
  uVar77 = uVar75 + uVar78;
  auVar62._8_8_ =
       SUB168(auVar20 * ZEXT816(0x4d2),8) + SUB168(auVar19 * auVar46,8) * 0x4d2 +
       SUB168(auVar18 * ZEXT816(0x4d2),8) + SUB168(auVar17 * auVar45,8) * 0x4d2 +
       SUB168(auVar14 * ZEXT816(0x4d2),8) + SUB168(auVar13 * auVar43,8) * 0x4d2 +
       SUB168(auVar8 * ZEXT816(0x4d2),8) + SUB168(auVar7 * auVar40,8) * 0x4d2 +
       (ulong)CARRY8(uVar73,uVar70) + (ulong)CARRY8(uVar75,uVar78) + (ulong)CARRY8(uVar76,uVar77);
  auVar62._0_8_ = uVar76 + uVar77;
  auVar62 = auVar35 * auVar61 + auVar62;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = auVar62._0_8_ & 0xfffffffffffff;
  auVar63._8_8_ = SUB168(auVar2 * ZEXT816(0x269),8) + SUB168(auVar1 * auVar37,8) * 0x269;
  auVar63._0_8_ = SUB168(auVar2 * ZEXT816(0x269),0);
  auVar64._8_8_ =
       SUB168(auVar10 * ZEXT816(0x269),8) + SUB168(auVar9 * auVar41,8) * 0x269 +
       SUB168(auVar4 * ZEXT816(0x269),8) + SUB168(auVar3 * auVar38,8) * 0x269 +
       (ulong)CARRY8(uVar71,uVar68);
  auVar64._0_8_ = uVar71 + uVar68;
  uVar68 = uVar72 + uVar69;
  auVar65._8_8_ =
       SUB168(auVar16 * ZEXT816(0x269),8) + SUB168(auVar15 * auVar44,8) * 0x269 +
       SUB168(auVar12 * ZEXT816(0x269),8) + SUB168(auVar11 * auVar42,8) * 0x269 +
       SUB168(auVar6 * ZEXT816(0x269),8) + SUB168(auVar5 * auVar39,8) * 0x269 +
       (ulong)CARRY8(uVar72,uVar69) + (ulong)CARRY8(uVar74,uVar68);
  auVar65._0_8_ = uVar74 + uVar68;
  auVar1 = (auVar62 >> 0x34) + auVar34 * auVar60 + auVar30 * auVar56 + auVar65;
  auVar2 = (auVar1 >> 0x33) + auVar33 * auVar59 + auVar29 * auVar55 + auVar26 * auVar52 + auVar64;
  auVar3 = (auVar2 >> 0x33) +
           auVar32 * auVar58 + auVar28 * auVar54 + auVar25 * auVar51 + auVar23 * auVar49 + auVar63;
  uVar70 = auVar3._0_8_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = auVar3._8_8_ << 0xd | uVar70 >> 0x33;
  auVar66 = auVar31 * auVar57 +
            auVar27 * auVar53 + auVar24 * auVar50 + auVar22 * auVar48 + auVar21 * auVar47 + auVar66;
  uVar71 = auVar66._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = auVar66._8_8_ * 0x2000 | uVar71 >> 0x33;
  auVar67 = auVar36 * ZEXT816(0x269) + auVar67;
  uVar69 = auVar67._0_8_;
  uVar68 = (auVar67._8_8_ * 0x1000 | uVar69 >> 0x34) + (auVar1._0_8_ & 0x7ffffffffffff);
  *in_RDI = uVar69 & 0xfffffffffffff;
  in_RDI[1] = uVar68 & 0x7ffffffffffff;
  in_RDI[2] = (uVar68 >> 0x33 & 0xff) + (auVar2._0_8_ & 0x7ffffffffffff);
  in_RDI[3] = uVar70 & 0x7ffffffffffff;
  in_RDI[4] = uVar71 & 0x7ffffffffffff;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(
    uint64_t out1[5], const uint64_t arg1[5], const uint64_t arg2[5]) {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x1;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x2;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x3;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x4;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x5;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x6;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x7;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x8;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x9;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x10;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x11;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x12;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x13;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x14;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x15;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x16;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x17;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x18;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x19;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x20;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x21;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x22;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x23;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x24;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x25;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x26;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x27;
    uint64_t x28;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x29;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x30;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x31;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x32;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x33;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x34;
    uint64_t x35;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x36;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x37;
    uint64_t x38;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x39;
    uint64_t x40;
    uint64_t x41;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x42;
    uint64_t x43;
    uint64_t x44;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x45;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128 x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x50;
    uint64_t x51;
    uint64_t x52;
    x1 = (UINT16_C(0x269) *
          ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[4]) *
           (arg2[4])));
    x2 = (UINT16_C(0x269) *
          ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[4]) *
           (arg2[3])));
    x3 = (UINT16_C(0x269) *
          ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[4]) *
           (arg2[2])));
    x4 = (UINT16_C(0x269) *
          (((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[4]) *
            (arg2[1])) *
           0x2));
    x5 = (UINT16_C(0x269) *
          ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[3]) *
           (arg2[4])));
    x6 = (UINT16_C(0x269) *
          ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[3]) *
           (arg2[3])));
    x7 = (UINT16_C(0x269) *
          (((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[3]) *
            (arg2[2])) *
           0x2));
    x8 = (UINT16_C(0x269) *
          ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[2]) *
           (arg2[4])));
    x9 = (UINT16_C(0x269) *
          (((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[2]) *
            (arg2[3])) *
           0x2));
    x10 = (UINT16_C(0x269) *
           (((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[1]) *
             (arg2[4])) *
            0x2));
    x11 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[4]) *
           (arg2[0]));
    x12 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[3]) *
           ((arg2[1]) * 0x2));
    x13 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[3]) *
           (arg2[0]));
    x14 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[2]) *
           ((arg2[2]) * 0x2));
    x15 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[2]) *
           ((arg2[1]) * 0x2));
    x16 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[2]) *
           (arg2[0]));
    x17 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[1]) *
           ((arg2[3]) * 0x2));
    x18 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[1]) *
           ((arg2[2]) * 0x2));
    x19 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[1]) *
           ((arg2[1]) * 0x2));
    x20 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[1]) *
           (arg2[0]));
    x21 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[0]) *
           (arg2[4]));
    x22 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[0]) *
           (arg2[3]));
    x23 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[0]) *
           (arg2[2]));
    x24 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[0]) *
           (arg2[1]));
    x25 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)(arg1[0]) *
           (arg2[0]));
    x26 = (x25 + (x10 + (x9 + (x7 + x4))));
    x27 = (x26 >> 52);
    x28 = (uint64_t)(x26 & UINT64_C(0xfffffffffffff));
    x29 = (x21 + (x17 + (x14 + (x12 + x11))));
    x30 = (x22 + (x18 + (x15 + (x13 + x1))));
    x31 = (x23 + (x19 + (x16 + (x5 + x2))));
    x32 = (x24 + (x20 + (x8 + (x6 + x3))));
    x33 = (x27 + x32);
    x34 = (x33 >> 51);
    x35 = (uint64_t)(x33 & UINT64_C(0x7ffffffffffff));
    x36 = (x34 + x31);
    x37 = (x36 >> 51);
    x38 = (uint64_t)(x36 & UINT64_C(0x7ffffffffffff));
    x39 = (x37 + x30);
    x40 = (uint64_t)(x39 >> 51);
    x41 = (uint64_t)(x39 & UINT64_C(0x7ffffffffffff));
    x42 = (x40 + x29);
    x43 = (uint64_t)(x42 >> 51);
    x44 = (uint64_t)(x42 & UINT64_C(0x7ffffffffffff));
    x45 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_uint128)UINT16_C(0x269) *
           x43);
    x46 = (x28 + x45);
    x47 = (uint64_t)(x46 >> 52);
    x48 = (uint64_t)(x46 & UINT64_C(0xfffffffffffff));
    x49 = (x47 + x35);
    x50 = (fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1)(x49 >> 51);
    x51 = (x49 & UINT64_C(0x7ffffffffffff));
    x52 = (x50 + x38);
    out1[0] = x48;
    out1[1] = x51;
    out1[2] = x52;
    out1[3] = x41;
    out1[4] = x44;
}